

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_queue_stdlib.cc
# Opt level: O2

void __thiscall
dd::TaskQueueStdlib::TaskQueueStdlib
          (TaskQueueStdlib *this,string *queue_name,ThreadPriority priority)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_TaskQueueBase)._vptr_TaskQueueBase = (_func_int **)&PTR_Delete_00137c70;
  Event::Event(&this->_started,false,false);
  Event::Event(&this->_stopped,false,false);
  Event::Event(&this->_flag_notify,false,false);
  PlatformThread::PlatformThread(&this->_thread,ThreadMain,this,queue_name,priority);
  Lock::Lock(&this->_pending_lock);
  this->_thread_should_quit = false;
  this->_thread_posting_order = 0;
  std::
  queue<std::pair<unsigned_long,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>,std::deque<std::pair<unsigned_long,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>,std::allocator<std::pair<unsigned_long,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>>>>
  ::
  queue<std::deque<std::pair<unsigned_long,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>,std::allocator<std::pair<unsigned_long,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>>>,void>
            (&this->_pending_queue);
  p_Var1 = &(this->_delayed_queue)._M_t._M_impl.super__Rb_tree_header;
  (this->_delayed_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_delayed_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_delayed_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_delayed_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_delayed_queue)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  PlatformThread::Start(&this->_thread);
  Event::Wait(&this->_started,-1);
  return;
}

Assistant:

TaskQueueStdlib::TaskQueueStdlib(const std::string &queue_name, ThreadPriority priority)
		:_started(false, false),
		_stopped(false, false),
		_flag_notify(false, false),
		_thread(&TaskQueueStdlib::ThreadMain, this, queue_name, priority)
	{
		_thread.Start();
		_started.Wait(-1);
	}